

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic
          (DiagnosticsReporter *this,DiagnosticDescriptor *desc)

{
  SyntaxTree *this_00;
  bool bVar1;
  key_type *__k;
  iterator iVar2;
  pair<psy::DiagnosticDescriptor,_unsigned_int> *this_01;
  DiagnosticDescriptor DStack_168;
  pair<psy::DiagnosticDescriptor,_unsigned_int> local_100;
  pair<psy::DiagnosticDescriptor,_unsigned_long> local_90;
  
  this_01 = (pair<psy::DiagnosticDescriptor,_unsigned_int> *)&DStack_168;
  bVar1 = willBacktrack(this->parser_);
  if (!bVar1) {
    __k = (key_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->IDsForDelay_)._M_h,__k);
    if (iVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = this->parser_->tree_;
      DiagnosticDescriptor::DiagnosticDescriptor(&DStack_168,desc);
      SyntaxTree::newDiagnostic(this_00,&DStack_168,(ulong)this->parser_->curTkIdx_);
    }
    else {
      std::pair<psy::DiagnosticDescriptor,_unsigned_int>::
      pair<psy::DiagnosticDescriptor_&,_unsigned_int_&,_true>
                (&local_100,desc,&this->parser_->curTkIdx_);
      std::pair<psy::DiagnosticDescriptor,_unsigned_long>::
      pair<psy::DiagnosticDescriptor,_unsigned_int,_true>(&local_90,&local_100);
      std::
      vector<std::pair<psy::DiagnosticDescriptor,unsigned_long>,std::allocator<std::pair<psy::DiagnosticDescriptor,unsigned_long>>>
      ::emplace_back<std::pair<psy::DiagnosticDescriptor,unsigned_long>>
                ((vector<std::pair<psy::DiagnosticDescriptor,unsigned_long>,std::allocator<std::pair<psy::DiagnosticDescriptor,unsigned_long>>>
                  *)&this->delayedDiags_,&local_90);
      DiagnosticDescriptor::~DiagnosticDescriptor(&local_90.first);
      this_01 = &local_100;
    }
    DiagnosticDescriptor::~DiagnosticDescriptor(&this_01->first);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic(DiagnosticDescriptor&& desc)
{
    if (parser_->willBacktrack())
        return;

    if (IDsForDelay_.find(desc.id()) != IDsForDelay_.end())
        delayedDiags_.push_back(std::make_pair(desc, parser_->curTkIdx_));
    else
        parser_->tree_->newDiagnostic(desc, parser_->curTkIdx_);
}